

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopUtils::MakeLoopClosedSSA(LoopUtils *this)

{
  IRContext *pIVar1;
  bool bVar2;
  Analysis AVar3;
  BasicBlock *pBVar4;
  Function *f;
  CFG *this_00;
  DominatorAnalysis *this_01;
  DominatorTree *dom_tree_00;
  reference puVar5;
  BasicBlockListTy *blocks;
  BasicBlock *local_178;
  uint32_t local_16c;
  undefined1 local_168 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  merging_bb_id;
  LCSSARewriter lcssa_rewriter;
  BasicBlock *local_c0;
  uint32_t local_b4;
  _Node_iterator_base<unsigned_int,_false> _Stack_b0;
  uint32_t bb_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_bb_id;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  exit_bb;
  DominatorTree *dom_tree;
  CFG *cfg;
  Function *function;
  LoopUtils *this_local;
  
  CreateLoopDedicatedExits(this);
  pBVar4 = Loop::GetHeaderBlock(this->loop_);
  f = BasicBlock::GetParent(pBVar4);
  this_00 = IRContext::cfg(this->context_);
  this_01 = IRContext::GetDominatorAnalysis(this->context_,f);
  dom_tree_00 = DominatorAnalysisBase::GetDomTree(&this_01->super_DominatorAnalysisBase);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&exit_bb_id._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2);
  Loop::GetExitBlocks(this->loop_,
                      (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range2);
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  _Stack_b0._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&__range2);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffff50);
    if (!bVar2) break;
    puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    local_b4 = *puVar5;
    local_c0 = CFG::block(this_00,local_b4);
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)&exit_bb_id._M_h._M_single_bucket,&local_c0);
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2);
  pIVar1 = this->context_;
  pBVar4 = Loop::GetMergeBlock(this->loop_);
  anon_unknown_15::LCSSARewriter::LCSSARewriter
            ((LCSSARewriter *)&merging_bb_id._M_h._M_single_bucket,pIVar1,dom_tree_00,
             (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)&exit_bb_id._M_h._M_single_bucket,pBVar4);
  pIVar1 = this->context_;
  blocks = Loop::GetBlocks(this->loop_);
  anon_unknown_15::MakeSetClosedSSA
            (pIVar1,f,blocks,
             (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)&exit_bb_id._M_h._M_single_bucket,
             (LCSSARewriter *)&merging_bb_id._M_h._M_single_bucket);
  pBVar4 = Loop::GetMergeBlock(this->loop_);
  if (pBVar4 != (BasicBlock *)0x0) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_168);
    Loop::GetMergingBlocks
              (this->loop_,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_168);
    pBVar4 = Loop::GetMergeBlock(this->loop_);
    local_16c = BasicBlock::id(pBVar4);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *)local_168,&local_16c);
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::clear((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
             *)&exit_bb_id._M_h._M_single_bucket);
    local_178 = Loop::GetMergeBlock(this->loop_);
    std::
    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
    ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              *)&exit_bb_id._M_h._M_single_bucket,&local_178);
    anon_unknown_15::MakeSetClosedSSA
              (this->context_,f,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_168,
               (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                *)&exit_bb_id._M_h._M_single_bucket,
               (LCSSARewriter *)&merging_bb_id._M_h._M_single_bucket);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_168);
  }
  pIVar1 = this->context_;
  AVar3 = operator|(kAnalysisCFG,kAnalysisDominatorAnalysis);
  AVar3 = operator|(AVar3,kAnalysisLoopAnalysis);
  IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar3);
  anon_unknown_15::LCSSARewriter::~LCSSARewriter
            ((LCSSARewriter *)&merging_bb_id._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&exit_bb_id._M_h._M_single_bucket);
  return;
}

Assistant:

void LoopUtils::MakeLoopClosedSSA() {
  CreateLoopDedicatedExits();

  Function* function = loop_->GetHeaderBlock()->GetParent();
  CFG& cfg = *context_->cfg();
  DominatorTree& dom_tree =
      context_->GetDominatorAnalysis(function)->GetDomTree();

  std::unordered_set<BasicBlock*> exit_bb;
  {
    std::unordered_set<uint32_t> exit_bb_id;
    loop_->GetExitBlocks(&exit_bb_id);
    for (uint32_t bb_id : exit_bb_id) {
      exit_bb.insert(cfg.block(bb_id));
    }
  }

  LCSSARewriter lcssa_rewriter(context_, dom_tree, exit_bb,
                               loop_->GetMergeBlock());
  MakeSetClosedSSA(context_, function, loop_->GetBlocks(), exit_bb,
                   &lcssa_rewriter);

  // Make sure all defs post-dominated by the merge block have their last use no
  // further than the merge block.
  if (loop_->GetMergeBlock()) {
    std::unordered_set<uint32_t> merging_bb_id;
    loop_->GetMergingBlocks(&merging_bb_id);
    merging_bb_id.erase(loop_->GetMergeBlock()->id());
    // Reset the exit set, now only the merge block is the exit.
    exit_bb.clear();
    exit_bb.insert(loop_->GetMergeBlock());
    // LCSSARewriter is reusable here only because it forces the creation of a
    // phi instruction in the merge block.
    MakeSetClosedSSA(context_, function, merging_bb_id, exit_bb,
                     &lcssa_rewriter);
  }

  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisCFG |
      IRContext::Analysis::kAnalysisDominatorAnalysis |
      IRContext::Analysis::kAnalysisLoopAnalysis);
}